

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall DACSThinker::DACSThinker(DACSThinker *this)

{
  ScriptMap *this_00;
  
  DThinker::DThinker(&this->super_DThinker,0x67);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_006f7090;
  this_00 = &this->RunningScripts;
  (this->RunningScripts).NumUsed = 0;
  TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::SetNodeVector
            (this_00,1);
  if ((ActiveThinker.field_0 == (DACSThinker *)0x0) ||
     ((*(byte *)((long)ActiveThinker.field_0 + 0x20) & 0x20) != 0)) {
    ActiveThinker.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DACSThinker>_1)this;
    this->LastScript = (DLevelScript *)0x0;
    this->Scripts = (DLevelScript *)0x0;
    M_Free((this->RunningScripts).Nodes);
    this_00->Nodes = (Node *)0x0;
    (this->RunningScripts).LastFree = (Node *)0x0;
    (this->RunningScripts).Size = 0;
    (this->RunningScripts).NumUsed = 0;
    TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::SetNodeVector
              (this_00,1);
  }
  else {
    I_Error("Only one ACSThinker is allowed to exist at a time.\nCheck your code.");
  }
  return;
}

Assistant:

DACSThinker::DACSThinker ()
: DThinker(STAT_SCRIPTS)
{
	if (ActiveThinker)
	{
		I_Error ("Only one ACSThinker is allowed to exist at a time.\nCheck your code.");
	}
	else
	{
		ActiveThinker = this;
		Scripts = NULL;
		LastScript = NULL;
		RunningScripts.Clear();
	}
}